

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_playback(Pager *pPager,int isHot)

{
  i64 *pOffset;
  char cVar1;
  sqlite3_vfs *psVar2;
  char *pcVar3;
  ulong uVar4;
  sqlite3_io_methods *psVar5;
  u64 n;
  u32 uVar6;
  u32 uVar7;
  sqlite3_file *pJrnl;
  int iVar8;
  int iVar9;
  sqlite3_file *__s;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  bool bVar16;
  int res;
  u32 nRec;
  i64 nMasterJournal;
  Pgno mxPg;
  i64 szJ;
  int local_90;
  int local_80;
  u32 local_7c;
  char *local_78;
  sqlite3_vfs *local_70;
  char *local_68;
  ulong local_60;
  u32 local_54;
  ulong local_50;
  sqlite3_file *local_48;
  int local_3c;
  long local_38;
  
  psVar2 = pPager->pVfs;
  local_54 = 0;
  local_80 = 1;
  iVar8 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_50);
  uVar15 = 0;
  if (iVar8 == 0) {
    pcVar3 = pPager->pTmpSpace;
    iVar8 = readMasterJournal(pPager->jfd,pcVar3,pPager->pVfs->mxPathname + 1);
    if (iVar8 == 0) {
      uVar15 = 0;
      iVar8 = 0;
      if (*pcVar3 != '\0') {
        iVar8 = (*psVar2->xAccess)(psVar2,pcVar3,0,&local_80);
      }
      if ((iVar8 == 0) && (local_80 != 0)) {
        pOffset = &pPager->journalOff;
        pPager->journalOff = 0;
        local_90 = isHot;
        uVar15 = 0;
LAB_00123b46:
        iVar8 = readJournalHdr(pPager,isHot,local_50,&local_7c,&local_54);
        uVar7 = local_54;
        if (iVar8 == 0) {
          uVar12 = (ulong)pPager->sectorSize;
          if (local_7c == 0xffffffff) {
            local_7c = (u32)((long)(local_50 - uVar12) / ((long)pPager->pageSize + 8));
          }
          uVar4 = *pOffset;
          if ((local_7c == 0 && isHot == 0) && (pPager->journalHdr + uVar12 == uVar4)) {
            local_7c = (u32)((long)(local_50 - uVar4) / ((long)pPager->pageSize + 8));
          }
          uVar6 = local_7c;
          if (uVar4 == uVar12) {
            iVar8 = pager_truncate(pPager,local_54);
            if (iVar8 != 0) goto LAB_00123ab0;
            pPager->dbSize = uVar7;
          }
          if (uVar6 != 0) {
            bVar16 = local_90 == 0;
            iVar13 = 0;
            do {
              if (!bVar16) {
                pager_reset(pPager);
              }
              iVar8 = pager_playback_one_page(pPager,pOffset,(Bitvec *)0x0,1,0);
              if (iVar8 != 0) {
                if (iVar8 != 0x65) {
                  uVar15 = uVar15 - iVar13;
                  if (iVar8 != 0x20a) goto LAB_00123ca2;
                  goto LAB_00123c96;
                }
                *pOffset = local_50;
                uVar15 = uVar15 - iVar13;
                local_90 = 0;
                goto LAB_00123b46;
              }
              iVar13 = iVar13 + -1;
              bVar16 = true;
            } while (-uVar6 != iVar13);
            local_90 = 0;
            uVar15 = uVar15 + uVar6;
          }
          goto LAB_00123b46;
        }
        if (iVar8 != 0x65) goto LAB_00123ab0;
LAB_00123c96:
        pPager->changeCountDone = pPager->tempFile;
      }
      else {
LAB_00123ca2:
        pPager->changeCountDone = pPager->tempFile;
        if (iVar8 != 0) goto LAB_00123ab6;
      }
      pcVar3 = pPager->pTmpSpace;
      iVar8 = readMasterJournal(pPager->jfd,pcVar3,pPager->pVfs->mxPathname + 1);
      if ((iVar8 != 0) ||
         (((byte)(pPager->eState - 4) < 0xfd &&
          (iVar8 = sqlite3PagerSync(pPager,(char *)0x0), iVar8 != 0)))) goto LAB_00123ab6;
      iVar8 = pager_end_transaction(pPager,(uint)(*pcVar3 != '\0'),0);
      if ((iVar8 != 0) || ((iVar8 = 0, *pcVar3 == '\0' || (iVar8 = 0, local_80 == 0))))
      goto LAB_00123ab6;
      psVar2 = pPager->pVfs;
      n = (long)psVar2->szOsFile * 2;
      __s = (sqlite3_file *)sqlite3Malloc(n);
      if (__s == (sqlite3_file *)0x0) {
        iVar8 = 7;
        goto LAB_00123ab6;
      }
      memset(__s,0,n);
      local_68 = (char *)(long)psVar2->szOsFile;
      iVar8 = (*psVar2->xOpen)(psVar2,pcVar3,__s,0x4001,(int *)0x0);
      if (iVar8 == 0) {
        local_70 = psVar2;
        iVar8 = (*__s->pMethods->xFileSize)(__s,(sqlite3_int64 *)&local_60);
        if (iVar8 == 0) {
          local_38 = (long)local_70->mxPathname;
          pcVar10 = (char *)sqlite3Malloc(local_60 + local_38 + 2);
          uVar12 = local_60;
          if (pcVar10 != (char *)0x0) {
            local_78 = pcVar10;
            iVar8 = (*__s->pMethods->xRead)(__s,pcVar10,(int)local_60,0);
            pcVar10 = local_78;
            if (iVar8 == 0) {
              local_78[local_60] = '\0';
              if (0 < (long)local_60) {
                local_48 = (sqlite3_file *)(local_68 + (long)&__s->pMethods);
                local_38 = local_38 + 1;
                local_68 = local_78 + uVar12 + 1;
                do {
                  iVar13 = (*local_70->xAccess)(local_70,pcVar10,0,&local_3c);
                  pJrnl = local_48;
                  iVar8 = iVar13;
                  if (iVar13 != 0) {
LAB_00123fd6:
                    sqlite3_free(local_78);
                    goto LAB_00123fa3;
                  }
                  if (local_3c != 0) {
                    iVar8 = (*local_70->xOpen)(local_70,pcVar10,local_48,0x801,(int *)0x0);
                    if (iVar8 == 0) {
                      iVar8 = readMasterJournal(pJrnl,local_68,(u32)local_38);
                      psVar5 = pJrnl->pMethods;
                      if (psVar5 != (sqlite3_io_methods *)0x0) {
                        (*psVar5->xClose)(local_48);
                        local_48->pMethods = (sqlite3_io_methods *)0x0;
                      }
                      if ((iVar8 == 0) &&
                         ((*local_68 == '\0' ||
                          (iVar9 = strcmp(local_68,pcVar3), iVar8 = iVar13, iVar9 != 0))))
                      goto LAB_00123f22;
                    }
                    goto LAB_00123fd6;
                  }
LAB_00123f22:
                  pcVar14 = pcVar10 + ~(ulong)pcVar10;
                  pcVar11 = pcVar10;
                  do {
                    pcVar14 = pcVar14 + 1;
                    cVar1 = *pcVar11;
                    pcVar11 = pcVar11 + 1;
                  } while (cVar1 != '\0');
                  pcVar10 = pcVar10 + (ulong)((uint)pcVar14 & 0x3fffffff) + 1;
                } while ((long)pcVar10 - (long)local_78 < (long)local_60);
              }
              if (__s->pMethods != (sqlite3_io_methods *)0x0) {
                (*__s->pMethods->xClose)(__s);
                __s->pMethods = (sqlite3_io_methods *)0x0;
              }
              iVar8 = (*local_70->xDelete)(local_70,pcVar3,0);
              pcVar10 = local_78;
            }
            goto LAB_00123f9e;
          }
          iVar8 = 7;
        }
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = (char *)0x0;
      }
LAB_00123f9e:
      sqlite3_free(pcVar10);
LAB_00123fa3:
      if (__s->pMethods != (sqlite3_io_methods *)0x0) {
        (*__s->pMethods->xClose)(__s);
        __s->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(__s);
      goto LAB_00123ab6;
    }
  }
LAB_00123ab0:
  pPager->changeCountDone = pPager->tempFile;
LAB_00123ab6:
  if ((isHot != 0) && (uVar15 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar15,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar8;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zMaster = 0;       /* Name of master journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the master journal name from the journal, if it is present.
  ** If a master journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  **  mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zMaster = pPager->pTmpSpace;
  rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zMaster[0] ){
    rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
  }
  zMaster = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or 
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error 
  ** occurs. 
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){ 
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages 
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
    }

    /* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  if( pPager->fd->pMethods ){
    sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
  }
#endif

  /* If this playback is happening automatically as a result of an IO or 
  ** malloc error that occurred after the change-counter was updated but 
  ** before the transaction was committed, then the change-counter 
  ** modification may just have been reverted. If this happens in exclusive 
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    zMaster = pPager->pTmpSpace;
    rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zMaster[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zMaster[0] && res ){
    /* If there was a master journal and this routine will return success,
    ** see if it is possible to delete the master journal.
    */
    rc = pager_delmaster(pPager, zMaster);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}